

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,known_host *node,char *buf,size_t buflen,
                       size_t *outlen,int type)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  char *__format;
  LIBSSH2_SESSION *pLVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  char *local_50;
  char *namealloc;
  char *saltalloc;
  
  if (type != 1) {
    pLVar8 = hosts->session;
    pcVar7 = "Unsupported type of known-host information store";
    goto LAB_0011a58f;
  }
  uVar1 = node->typemask;
  sVar9 = (size_t)((uVar1 & 0x3c0000) - 0x40000 >> 0x12);
  switch(sVar9) {
  case 0:
    local_50 = (char *)0x0;
    break;
  case 1:
    sVar9 = 7;
    local_50 = "ssh-rsa";
    break;
  case 2:
    sVar9 = 7;
    local_50 = "ssh-dss";
    break;
  case 3:
    sVar9 = 0x13;
    local_50 = "ecdsa-sha2-nistp256";
    break;
  case 4:
    sVar9 = 0x13;
    local_50 = "ecdsa-sha2-nistp384";
    break;
  case 5:
    sVar9 = 0x13;
    local_50 = "ecdsa-sha2-nistp521";
    break;
  case 6:
    sVar9 = 0xb;
    local_50 = "ssh-ed25519";
    break;
  default:
switchD_0011a566_caseD_7:
    pLVar8 = hosts->session;
    pcVar7 = "Unsupported type of known-host entry";
LAB_0011a58f:
    iVar3 = _libssh2_error(pLVar8,-0x21,pcVar7);
    return iVar3;
  case 0xe:
    local_50 = node->key_type_name;
    if (local_50 == (char *)0x0) goto switchD_0011a566_caseD_7;
    sVar9 = node->key_type_len;
  }
  pcVar7 = node->key;
  sVar4 = strlen(pcVar7);
  lVar10 = sVar9 + 1;
  if (sVar9 == 0) {
    lVar10 = 0;
  }
  lVar10 = lVar10 + sVar4;
  pcVar2 = node->comment;
  if (pcVar2 != (char *)0x0) {
    lVar10 = lVar10 + node->comment_len + 1;
  }
  if ((short)uVar1 == 2) {
    sVar5 = _libssh2_base64_encode(hosts->session,node->name,node->name_len,&namealloc);
    pLVar8 = hosts->session;
    if (sVar5 == 0) {
      pcVar7 = "Unable to allocate memory for base64-encoded host name";
    }
    else {
      sVar6 = _libssh2_base64_encode(pLVar8,node->salt,node->salt_len,&saltalloc);
      if (sVar6 != 0) {
        uVar11 = sVar6 + lVar10 + sVar5 + 7;
        if (uVar11 <= buflen) {
          if (node->comment == (char *)0x0 || sVar9 == 0) {
            if (node->comment == (char *)0x0) {
              if (sVar9 == 0) {
                pcVar7 = "|1|%s|%s %s\n";
                local_50 = node->key;
              }
              else {
                pcVar7 = "|1|%s|%s %s %s\n";
              }
            }
            else {
              pcVar7 = "|1|%s|%s %s %s\n";
              local_50 = node->key;
            }
          }
          else {
            pcVar7 = "|1|%s|%s %s %s %s\n";
          }
          snprintf(buf,buflen,pcVar7,saltalloc,namealloc,local_50);
        }
        (*hosts->session->free)(namealloc,&hosts->session->abstract);
        (*hosts->session->free)(saltalloc,&hosts->session->abstract);
        goto LAB_0011a832;
      }
      (*hosts->session->free)(namealloc,&hosts->session->abstract);
      pLVar8 = hosts->session;
      pcVar7 = "Unable to allocate memory for base64-encoded salt";
    }
    iVar3 = -6;
  }
  else {
    uVar11 = lVar10 + node->name_len + 3;
    if (uVar11 <= buflen) {
      if (pcVar2 == (char *)0x0 || sVar9 == 0) {
        if (pcVar2 == (char *)0x0) {
          if (sVar9 == 0) {
            snprintf(buf,buflen,"%s %s\n",node->name,pcVar7);
            goto LAB_0011a832;
          }
          __format = "%s %s %s\n";
        }
        else {
          __format = "%s %s %s\n";
          local_50 = pcVar7;
          pcVar7 = pcVar2;
        }
      }
      else {
        __format = "%s %s %s %s\n";
      }
      snprintf(buf,buflen,__format,node->name,local_50,pcVar7);
    }
LAB_0011a832:
    *outlen = uVar11 - 1;
    if (uVar11 <= buflen) {
      return 0;
    }
    pLVar8 = hosts->session;
    pcVar7 = "Known-host write buffer too small";
    iVar3 = -0x26;
  }
  iVar3 = _libssh2_error(pLVar8,iVar3,pcVar7);
  return iVar3;
}

Assistant:

static int
knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,
                    struct known_host *node,
                    char *buf, size_t buflen,
                    size_t *outlen, int type)
{
    size_t required_size;

    const char *key_type_name;
    size_t key_type_len;

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    switch(node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK) {
    case LIBSSH2_KNOWNHOST_KEY_RSA1:
        key_type_name = NULL;
        key_type_len = 0;
        break;
    case LIBSSH2_KNOWNHOST_KEY_SSHRSA:
        key_type_name = "ssh-rsa";
        key_type_len = 7;
        break;
    case LIBSSH2_KNOWNHOST_KEY_SSHDSS:
        key_type_name = "ssh-dss";
        key_type_len = 7;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_256:
        key_type_name = "ecdsa-sha2-nistp256";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_384:
        key_type_name = "ecdsa-sha2-nistp384";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_521:
        key_type_name = "ecdsa-sha2-nistp521";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ED25519:
        key_type_name = "ssh-ed25519";
        key_type_len = 11;
        break;
    case LIBSSH2_KNOWNHOST_KEY_UNKNOWN:
        key_type_name = node->key_type_name;
        if(key_type_name) {
            key_type_len = node->key_type_len;
            break;
        }
        /* otherwise fallback to default and error */
        LIBSSH2_FALLTHROUGH();
    default:
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host entry");
    }

    /* When putting together the host line there are three aspects to consider:
       - Hashed (SHA1) or unhashed hostname
       - key name or no key name (RSA1)
       - comment or no comment

       This means there are 2^3 different formats:
       ("|1|%s|%s %s %s %s\n", salt, hashed_host, key_name, key, comment)
       ("|1|%s|%s %s %s\n", salt, hashed_host, key_name, key)
       ("|1|%s|%s %s %s\n", salt, hashed_host, key, comment)
       ("|1|%s|%s %s\n", salt, hashed_host, key)
       ("%s %s %s %s\n", host, key_name, key, comment)
       ("%s %s %s\n", host, key_name, key)
       ("%s %s %s\n", host, key, comment)
       ("%s %s\n", host, key)

       Even if the buffer is too small, we have to set outlen to the number of
       characters the complete line would have taken.  We also don't write
       anything to the buffer unless we are sure we can write everything to the
       buffer. */

    required_size = strlen(node->key);

    if(key_type_len)
        required_size += key_type_len + 1; /* ' ' = 1 */
    if(node->comment)
        required_size += node->comment_len + 1; /* ' ' = 1 */

    if((node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) ==
       LIBSSH2_KNOWNHOST_TYPE_SHA1) {
        char *namealloc;
        size_t name_base64_len;
        char *saltalloc;
        size_t salt_base64_len;

        name_base64_len = _libssh2_base64_encode(hosts->session, node->name,
                                                 node->name_len, &namealloc);
        if(!name_base64_len)
            return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "base64-encoded host name");

        salt_base64_len = _libssh2_base64_encode(hosts->session,
                                                 node->salt, node->salt_len,
                                                 &saltalloc);
        if(!salt_base64_len) {
            LIBSSH2_FREE(hosts->session, namealloc);
            return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "base64-encoded salt");
        }

        required_size += salt_base64_len + name_base64_len + 7;
        /* |1| + | + ' ' + \n + \0 = 7 */

        if(required_size <= buflen) {
            if(node->comment && key_type_len)
                snprintf(buf, buflen, "|1|%s|%s %s %s %s\n", saltalloc,
                         namealloc, key_type_name, node->key, node->comment);
            else if(node->comment)
                snprintf(buf, buflen, "|1|%s|%s %s %s\n", saltalloc, namealloc,
                         node->key, node->comment);
            else if(key_type_len)
                snprintf(buf, buflen, "|1|%s|%s %s %s\n", saltalloc, namealloc,
                         key_type_name, node->key);
            else
                snprintf(buf, buflen, "|1|%s|%s %s\n", saltalloc, namealloc,
                         node->key);
        }

        LIBSSH2_FREE(hosts->session, namealloc);
        LIBSSH2_FREE(hosts->session, saltalloc);
    }
    else {
        required_size += node->name_len + 3;
        /* ' ' + '\n' + \0 = 3 */

        if(required_size <= buflen) {
            if(node->comment && key_type_len)
                snprintf(buf, buflen, "%s %s %s %s\n", node->name,
                         key_type_name, node->key, node->comment);
            else if(node->comment)
                snprintf(buf, buflen, "%s %s %s\n", node->name, node->key,
                         node->comment);
            else if(key_type_len)
                snprintf(buf, buflen, "%s %s %s\n", node->name, key_type_name,
                         node->key);
            else
                snprintf(buf, buflen, "%s %s\n", node->name, node->key);
        }
    }

    /* we report the full length of the data with the trailing zero excluded */
    *outlen = required_size-1;

    if(required_size <= buflen)
        return LIBSSH2_ERROR_NONE;
    else
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                              "Known-host write buffer too small");
}